

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

string * moveToAlgebraic_abi_cxx11_(string *__return_storage_ptr__,move change)

{
  long lVar1;
  undefined8 *puVar2;
  long *plVar3;
  size_type *psVar4;
  undefined8 uVar5;
  string extra;
  long *local_98;
  undefined8 local_90;
  long local_88;
  undefined8 uStack_80;
  string local_78;
  long *local_58;
  char *local_50;
  long local_48 [2];
  string local_38;
  
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  if ((uint3)((int3)change - 0x20000U) < 0x80000) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_58,0,local_50,
               (ulong)(&DAT_0010a370 + *(int *)(&DAT_0010a370 + (ulong)(change.special & 3 ^ 2) * 4)
                      ));
  }
  squareToAlgebraic_abi_cxx11_(&local_38,change.start);
  squareToAlgebraic_abi_cxx11_(&local_78,change.end);
  uVar5 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    uVar5 = local_38.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar5 < local_78._M_string_length + local_38._M_string_length) {
    uVar5 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar5 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + local_38._M_string_length <= (ulong)uVar5) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_78,0,(char *)0x0,(ulong)local_38._M_dataplus._M_p);
      goto LAB_00108161;
    }
  }
  puVar2 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_78._M_dataplus._M_p);
LAB_00108161:
  local_98 = &local_88;
  plVar3 = puVar2 + 2;
  if ((long *)*puVar2 == plVar3) {
    local_88 = *plVar3;
    uStack_80 = puVar2[3];
  }
  else {
    local_88 = *plVar3;
    local_98 = (long *)*puVar2;
  }
  local_90 = puVar2[1];
  *puVar2 = plVar3;
  puVar2[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_58);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar1 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string moveToAlgebraic(const move change) {
  std::string extra = "";
  if(change.special >= 2 && change.special <= 9) {
    switch((change.special - 1) % 4) {
      case 1:
        extra = "q";
        break;
      case 2:
        extra = "r";
        break;
      case 3:
        extra = "n";
        break;
      default:
        extra = "b";
        break;
    }
  }
  return squareToAlgebraic(change.start) + squareToAlgebraic(change.end) + extra;
}